

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
BanSearchIRCCommand::trigger
          (BanSearchIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> lhs_02;
  basic_string_view<char,_std::char_traits<char>_> lhs_03;
  basic_string_view<char,_std::char_traits<char>_> lhs_04;
  basic_string_view<char,_std::char_traits<char>_> lhs_05;
  bool bVar1;
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  *this_00;
  size_type sVar2;
  const_reference this_01;
  tm *ptVar3;
  size_type sVar4;
  char *pcVar5;
  size_type sVar6;
  char *pcVar7;
  size_type sVar8;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  size_t sVar9;
  char *pcVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  size_type local_788;
  char *local_780;
  uint local_778;
  size_type local_770;
  char *local_768;
  uint64_t local_760;
  size_type local_758;
  char *local_750;
  size_type local_748;
  char *local_740;
  size_type local_738;
  char *local_730;
  string *local_728;
  IRC_Bot *local_720;
  IRC_Bot *local_718;
  IRC_Bot *local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_700;
  uint64_t local_6f8;
  char *local_6f0;
  size_type local_6e8;
  uint local_6dc;
  char *local_6d8;
  size_type local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined8 local_6b8;
  undefined1 local_6a9;
  undefined1 local_6a8;
  undefined1 local_6a7;
  undefined1 local_6a6;
  undefined1 local_6a5;
  undefined1 local_6a4;
  undefined1 local_6a3;
  undefined1 local_6a2;
  undefined1 local_6a1;
  char *local_6a0;
  size_t *local_698;
  duration local_690;
  rep local_688;
  undefined1 local_679;
  size_type local_678;
  undefined1 local_66f;
  undefined1 local_66e;
  undefined1 local_66d;
  undefined1 local_66c;
  undefined1 local_66b;
  undefined1 local_66a;
  undefined1 local_669;
  basic_string_view<char,_std::char_traits<char>_> *local_668;
  undefined1 local_659;
  IRC_Bot *local_658;
  basic_string_view<char,_std::char_traits<char>_> *local_650;
  string local_648;
  __sv_type local_628;
  size_t local_618;
  char *pcStack_610;
  basic_string_view<char,_std::char_traits<char>_> local_608;
  size_t local_5f8;
  char *pcStack_5f0;
  __sv_type local_5e8;
  size_t local_5d8;
  char *pcStack_5d0;
  basic_string_view<char,_std::char_traits<char>_> local_5c8;
  basic_string_view<char,_std::char_traits<char>_> local_5b8;
  string local_5a8;
  basic_string_view<char,_std::char_traits<char>_> local_588;
  basic_string_view<char,_std::char_traits<char>_> local_578;
  basic_string_view<char,_std::char_traits<char>_> local_568;
  basic_string_view<char,_std::char_traits<char>_> local_558;
  basic_string_view<char,_std::char_traits<char>_> local_548;
  basic_string_view<char,_std::char_traits<char>_> local_538;
  basic_string_view<char,_std::char_traits<char>_> local_528;
  basic_string_view<char,_std::char_traits<char>_> local_518;
  basic_string_view<char,_std::char_traits<char>_> local_508;
  basic_string_view<char,_std::char_traits<char>_> local_4f8;
  time_point local_4e8;
  time_t local_4e0;
  time_t expire_time;
  time_t added_time;
  string ip_str;
  size_t i;
  char expireStr [256];
  char dateStr [256];
  string types;
  string out;
  string_view type_str;
  undefined1 auStack_120 [4];
  uint type;
  pointer *local_118;
  string_view *local_110;
  undefined1 local_108 [8];
  function<bool_(unsigned_int)> isMatch;
  string_view params;
  pointer local_d0;
  Entry *entry;
  size_t local_b8;
  char *pcStack_b0;
  undefined1 auStack_a8 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  char *local_80;
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  *entries;
  IRC_Bot *source_local;
  BanSearchIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar10 = nick._M_str;
  sVar9 = nick._M_len;
  in_whitespace = (basic_string_view<char,_std::char_traits<char>_> *)channel._M_str;
  local_650 = &parameters;
  this_00 = (vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
             *)RenX::BanDatabase::getEntries();
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_650);
  if (bVar1) {
    local_720 = source;
    local_618 = sVar9;
    pcStack_610 = pcVar10;
    sVar2 = std::
            vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
            ::size(this_00);
    local_728 = &local_648;
    string_printf_abi_cxx11_(local_728,"There are a total of %u entries in the ban database.",sVar2)
    ;
    local_628 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_728);
    Jupiter::IRC::Client::sendNotice
              (local_720,local_618,pcStack_610,local_628._M_len,local_628._M_str);
    std::__cxx11::string::~string((string *)&local_648);
    return;
  }
  sVar2 = std::
          vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
          ::size(this_00);
  if (sVar2 == 0) {
    local_658 = source;
    join_0x00000010_0x00000000_ = sv("The ban database is empty!",0x1a);
    Jupiter::IRC::Client::sendNotice(local_658,sVar9,pcVar10,command_split.second._M_str,local_80);
    return;
  }
  local_b8 = local_650->_M_len;
  pcStack_b0 = local_650->_M_str;
  local_668 = (basic_string_view<char,_std::char_traits<char>_> *)&entry;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_668," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)auStack_a8,(jessilib *)&local_b8,local_668,in_whitespace);
  isMatch._M_invoker = (_Invoker_type)command_split.first._M_str;
  _auStack_120 = (function<bool_(unsigned_int)> *)local_108;
  local_118 = &local_d0;
  local_110 = (string_view *)&isMatch._M_invoker;
  std::function<bool(unsigned_int)>::
  function<BanSearchIRCCommand::trigger(IRC_Bot*,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0,void>
            ((function<bool(unsigned_int)> *)_auStack_120,(anon_class_24_3_b2077666 *)auStack_120);
  bVar11 = sv("all",3);
  bVar12._M_str = (char *)command_split.first._M_len;
  bVar12._M_len = (size_t)auStack_a8;
  local_659 = jessilib::equalsi<char,char>(bVar12,bVar11);
  if (!(bool)local_659) {
    bVar12 = sv("*",1);
    bVar11._M_str = (char *)command_split.first._M_len;
    bVar11._M_len = (size_t)auStack_a8;
    bVar1 = std::operator==(bVar11,bVar12);
    if (!bVar1) {
      bVar12 = sv("ip",2);
      lhs_05._M_str = (char *)command_split.first._M_len;
      lhs_05._M_len = (size_t)auStack_a8;
      local_669 = jessilib::equalsi<char,char>(lhs_05,bVar12);
      if ((bool)local_669) {
        type_str._M_str._4_4_ = 2;
      }
      else {
        bVar12 = sv("hwid",4);
        lhs_04._M_str = (char *)command_split.first._M_len;
        lhs_04._M_len = (size_t)auStack_a8;
        local_66a = jessilib::equalsi<char,char>(lhs_04,bVar12);
        if ((bool)local_66a) {
          type_str._M_str._4_4_ = 3;
        }
        else {
          bVar12 = sv("rdns",4);
          lhs_03._M_str = (char *)command_split.first._M_len;
          lhs_03._M_len = (size_t)auStack_a8;
          local_66b = jessilib::equalsi<char,char>(lhs_03,bVar12);
          if ((bool)local_66b) {
            type_str._M_str._4_4_ = 4;
          }
          else {
            bVar12 = sv("steam",5);
            lhs_02._M_str = (char *)command_split.first._M_len;
            lhs_02._M_len = (size_t)auStack_a8;
            local_66c = jessilib::equalsi<char,char>(lhs_02,bVar12);
            if ((bool)local_66c) {
              type_str._M_str._4_4_ = 5;
            }
            else {
              bVar12 = sv("name",4);
              lhs_01._M_str = (char *)command_split.first._M_len;
              lhs_01._M_len = (size_t)auStack_a8;
              local_66d = jessilib::equalsi<char,char>(lhs_01,bVar12);
              if ((bool)local_66d) {
                type_str._M_str._4_4_ = 6;
              }
              else {
                bVar12 = sv("banner",6);
                lhs_00._M_str = (char *)command_split.first._M_len;
                lhs_00._M_len = (size_t)auStack_a8;
                local_66e = jessilib::equalsi<char,char>(lhs_00,bVar12);
                if ((bool)local_66e) {
                  type_str._M_str._4_4_ = 7;
                }
                else {
                  bVar12 = sv("active",6);
                  lhs._M_str = (char *)command_split.first._M_len;
                  lhs._M_len = (size_t)auStack_a8;
                  local_66f = jessilib::equalsi<char,char>(lhs,bVar12);
                  if ((bool)local_66f) {
                    type_str._M_str._4_4_ = 8;
                  }
                  else {
                    type_str._M_str._4_4_ = 0;
                    isMatch._M_invoker = (_Invoker_type)local_650->_M_len;
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_0014c0eb;
    }
  }
  type_str._M_str._4_4_ = 1;
LAB_0014c0eb:
  std::__cxx11::string::string((string *)(types.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(dateStr + 0xf8));
  ip_str.field_2._8_8_ = 0;
  while( true ) {
    local_678 = ip_str.field_2._8_8_;
    sVar2 = std::
            vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
            ::size(this_00);
    if (local_678 == sVar2) break;
    this_01 = std::
              vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
              ::operator[](this_00,ip_str.field_2._8_8_);
    local_d0 = std::
               unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               ::get(this_01);
    local_679 = std::function<bool_(unsigned_int)>::operator()
                          ((function<bool_(unsigned_int)> *)local_108,type_str._M_str._4_4_);
    if ((bool)local_679) {
      Jupiter::Socket::ntop4_abi_cxx11_((uint)&added_time);
      expire_time = std::chrono::_V2::system_clock::to_time_t(&local_d0->timestamp);
      local_688 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_d0->length);
      if (local_688 == 0) {
        strcpy((char *)&i,"never");
      }
      else {
        local_690.__r = (rep)std::chrono::operator+(&local_d0->timestamp,&local_d0->length);
        local_4e8.__d.__r = (duration)(duration)local_690.__r;
        local_4e0 = std::chrono::_V2::system_clock::to_time_t(&local_4e8);
        local_698 = &i;
        ptVar3 = localtime(&local_4e0);
        strftime((char *)local_698,0x100,"%b %d %Y, %H:%M:%S",ptVar3);
      }
      local_6a0 = expireStr + 0xf8;
      ptVar3 = localtime(&expire_time);
      strftime(local_6a0,0x100,"%b %d %Y, %H:%M:%S",ptVar3);
      if ((local_d0->flags & 0x7fff) == 0) {
        local_4f8 = sv(" NULL;",6);
        std::__cxx11::string::operator=((string *)(dateStr + 0xf8),&local_4f8);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (dateStr + 0xf8));
        local_6a1 = RenX::BanDatabase::Entry::is_rdns_ban(local_d0);
        if ((bool)local_6a1) {
          local_508 = sv(" rdns",5);
          std::__cxx11::string::operator+=((string *)(dateStr + 0xf8),&local_508);
        }
        local_6a2 = RenX::BanDatabase::Entry::is_type_game(local_d0);
        if ((bool)local_6a2) {
          local_518 = sv(" game",5);
          std::__cxx11::string::operator+=((string *)(dateStr + 0xf8),&local_518);
        }
        local_6a3 = RenX::BanDatabase::Entry::is_type_chat(local_d0);
        if ((bool)local_6a3) {
          local_528 = sv(" chat",5);
          std::__cxx11::string::operator+=((string *)(dateStr + 0xf8),&local_528);
        }
        local_6a4 = RenX::BanDatabase::Entry::is_type_bot(local_d0);
        if ((bool)local_6a4) {
          local_538 = sv(" bot",4);
          std::__cxx11::string::operator+=((string *)(dateStr + 0xf8),&local_538);
        }
        local_6a5 = RenX::BanDatabase::Entry::is_type_vote(local_d0);
        if ((bool)local_6a5) {
          local_548 = sv(" vote",5);
          std::__cxx11::string::operator+=((string *)(dateStr + 0xf8),&local_548);
        }
        local_6a6 = RenX::BanDatabase::Entry::is_type_mine(local_d0);
        if ((bool)local_6a6) {
          local_558 = sv(" mine",5);
          std::__cxx11::string::operator+=((string *)(dateStr + 0xf8),&local_558);
        }
        local_6a7 = RenX::BanDatabase::Entry::is_type_ladder(local_d0);
        if ((bool)local_6a7) {
          local_568 = sv(" ladder",7);
          std::__cxx11::string::operator+=((string *)(dateStr + 0xf8),&local_568);
        }
        local_6a8 = RenX::BanDatabase::Entry::is_type_alert(local_d0);
        if ((bool)local_6a8) {
          local_578 = sv(" alert",6);
          std::__cxx11::string::operator+=((string *)(dateStr + 0xf8),&local_578);
        }
        local_588 = sv(";",1);
        std::__cxx11::string::operator+=((string *)(dateStr + 0xf8),&local_588);
      }
      local_6b8 = ip_str.field_2._8_8_;
      local_6a9 = RenX::BanDatabase::Entry::is_active(local_d0);
      local_6c8 = "04in";
      if ((bool)local_6a9) {
        local_6c8 = "12";
      }
      local_708 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&added_time;
      local_6d0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(local_708);
      local_6d8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(local_708);
      local_6dc = (uint)local_d0->prefix_length;
      local_6e8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&local_d0->hwid);
      local_6f0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(&local_d0->hwid);
      local_6f8 = local_d0->steamid;
      local_700 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (dateStr + 0xf8);
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (local_700);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         (local_700);
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&local_d0->name);
      pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         (&local_d0->name);
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&local_d0->banner);
      local_730 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  data(&local_d0->banner);
      local_760 = local_6f8;
      local_768 = local_6f0;
      local_770 = local_6e8;
      local_778 = local_6dc;
      local_780 = local_6d8;
      local_788 = local_6d0;
      local_758 = sVar4;
      local_750 = pcVar5;
      local_748 = sVar6;
      local_740 = pcVar7;
      local_738 = sVar8;
      local_6c0 = (undefined1 *)&local_788;
      string_printf_abi_cxx11_
                (&local_5a8,
                 "ID: %lu (\x03%sactive\x03); Added: %s; Expires: %s; IP: %.*s/%u; HWID: %.*s; Steam: %llu; Types:%.*s Name: %.*s; Banner: %.*s"
                 ,local_6b8,local_6c8,expireStr + 0xf8,&i);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&types.field_2 + 8),&local_5a8);
      std::__cxx11::string::~string((string *)&local_5a8);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&local_d0->rdns);
      if (!bVar1) {
        local_5b8 = sv("; RDNS: ",8);
        std::__cxx11::string::operator+=((string *)(types.field_2._M_local_buf + 8),&local_5b8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&types.field_2 + 8),&local_d0->rdns);
      }
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        (&local_d0->reason);
      if (!bVar1) {
        local_5c8 = sv("; Reason: ",10);
        std::__cxx11::string::operator+=((string *)(types.field_2._M_local_buf + 8),&local_5c8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&types.field_2 + 8),&local_d0->reason);
      }
      local_710 = source;
      local_5d8 = sVar9;
      pcStack_5d0 = pcVar10;
      local_5e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(types.field_2._M_local_buf + 8));
      Jupiter::IRC::Client::sendNotice
                (local_710,local_5d8,pcStack_5d0,local_5e8._M_len,local_5e8._M_str);
      std::__cxx11::string::~string((string *)&added_time);
    }
    ip_str.field_2._8_8_ = ip_str.field_2._8_8_ + 1;
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&types.field_2 + 8));
  if (bVar1) {
    local_718 = source;
    local_5f8 = sVar9;
    pcStack_5f0 = pcVar10;
    local_608 = sv("No matches found.",0x11);
    Jupiter::IRC::Client::sendNotice
              (local_718,local_5f8,pcStack_5f0,local_608._M_len,local_608._M_str);
  }
  std::__cxx11::string::~string((string *)(dateStr + 0xf8));
  std::__cxx11::string::~string((string *)(types.field_2._M_local_buf + 8));
  std::function<bool_(unsigned_int)>::~function((function<bool_(unsigned_int)> *)local_108);
  return;
}

Assistant:

void BanSearchIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	const auto& entries = RenX::banDatabase->getEntries();
	if (!parameters.empty()) {
		if (entries.size() == 0) {
			source->sendNotice(nick, "The ban database is empty!"sv);
		}
		else {
			auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);

			RenX::BanDatabase::Entry *entry;
			std::string_view params = command_split.second;
			std::function<bool(unsigned int)> isMatch = [&](unsigned int type_l) -> bool {
				switch (type_l)
				{
				default:
				case 0:	// ANY
					return isMatch(1) || isMatch(2) || isMatch(3) || isMatch(4);
				case 1: // ALL
					return true;
				case 2:	// IP
					return entry->ip == Jupiter::asUnsignedInt(params); // TODO: Actually parse as an IP address...
				case 3: // HWID
					return entry->hwid == params;
				case 4: // RDNS
					return entry->rdns == params;
				case 5:	// STEAM
					return entry->steamid == Jupiter::asUnsignedLongLong(params);
				case 6:	// NAME
					return jessilib::equalsi(entry->name, params);
				case 7:	// BANNER
					return jessilib::equalsi(entry->banner, params);
				case 8:	// ACTIVE
					return Jupiter::asBool(params) == entry->is_active();
				}
			};

			unsigned int type;
			std::string_view type_str = command_split.first;
			if (jessilib::equalsi(type_str, "all"sv) || type_str == "*"sv)
				type = 1;
			else if (jessilib::equalsi(type_str, "ip"sv))
				type = 2;
			else if (jessilib::equalsi(type_str, "hwid"sv))
				type = 3;
			else if (jessilib::equalsi(type_str, "rdns"sv))
				type = 4;
			else if (jessilib::equalsi(type_str, "steam"sv))
				type = 5;
			else if (jessilib::equalsi(type_str, "name"sv))
				type = 6;
			else if (jessilib::equalsi(type_str, "banner"sv))
				type = 7;
			else if (jessilib::equalsi(type_str, "active"sv))
				type = 8;
			else
			{
				type = 0;
				params = parameters;
			}

			std::string out;
			std::string types;
			char dateStr[256];
			char expireStr[256];
			for (size_t i = 0; i != entries.size(); i++) {
				entry = entries[i].get();
				if (isMatch(type)) {
					std::string ip_str = Jupiter::Socket::ntop4(entry->ip);

					time_t added_time = std::chrono::system_clock::to_time_t(entry->timestamp);
					if (entry->length.count() != 0) {
						time_t expire_time = std::chrono::system_clock::to_time_t(entry->timestamp + entry->length);
						strftime(expireStr, sizeof(expireStr), "%b %d %Y, %H:%M:%S", localtime(&expire_time));
					}
					else {
						std::strcpy(expireStr, "never");
					}
					strftime(dateStr, sizeof(dateStr), "%b %d %Y, %H:%M:%S", localtime(&added_time));

					if ((entry->flags & 0x7FFF) == 0)
						types = " NULL;"sv;
					else
					{
						types.clear();
						if (entry->is_rdns_ban())
							types += " rdns"sv;
						if (entry->is_type_game())
							types += " game"sv;
						if (entry->is_type_chat())
							types += " chat"sv;
						if (entry->is_type_bot())
							types += " bot"sv;
						if (entry->is_type_vote())
							types += " vote"sv;
						if (entry->is_type_mine())
							types += " mine"sv;
						if (entry->is_type_ladder())
							types += " ladder"sv;
						if (entry->is_type_alert())
							types += " alert"sv;
						types += ";"sv;
					}

					out = string_printf("ID: %lu (" IRCCOLOR "%sactive" IRCCOLOR "); Added: %s; Expires: %s; IP: %.*s/%u; HWID: %.*s; Steam: %llu; Types:%.*s Name: %.*s; Banner: %.*s",
						i, entry->is_active() ? "12" : "04in", dateStr, expireStr, ip_str.size(), ip_str.data(), entry->prefix_length, entry->hwid.size(), entry->hwid.data(), entry->steamid,
						types.size(), types.data(), entry->name.size(), entry->name.data(), entry->banner.size(), entry->banner.data());

					if (!entry->rdns.empty())
					{
						out += "; RDNS: "sv;
						out += entry->rdns;
					}
					if (!entry->reason.empty())
					{
						out += "; Reason: "sv;
						out += entry->reason;
					}
					source->sendNotice(nick, out);
				}
			}
			if (out.empty())
				source->sendNotice(nick, "No matches found."sv);
		}
	}
	else
		source->sendNotice(nick, string_printf("There are a total of %u entries in the ban database.", entries.size()));
}